

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_group
          (string *__return_storage_ptr__,Formatter *this,string *group,bool is_positional,
          vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *opts)

{
  pointer ppOVar1;
  ostream *poVar2;
  pointer ppOVar3;
  stringstream out;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
  poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(group->_M_dataplus)._M_p,group->_M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
  ppOVar3 = (opts->super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (opts->super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppOVar3 != ppOVar1) {
    do {
      (*(this->super_FormatterBase)._vptr_FormatterBase[0xb])
                (&local_1d8,this,*ppOVar3,(ulong)is_positional);
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1d8,local_1d0);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8,local_1c8[0] + 1);
      }
      ppOVar3 = ppOVar3 + 1;
    } while (ppOVar3 != ppOVar1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
Formatter::make_group(std::string group, bool is_positional, std::vector<const Option *> opts) const {
    std::stringstream out;

    out << "\n" << group << ":\n";
    for(const Option *opt : opts) {
        out << make_option(opt, is_positional);
    }

    return out.str();
}